

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O0

ans_fold_encode<3U> * ans_fold_encode<3U>::create(uint32_t *in_u32,size_t n)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  int iVar1;
  uint32_t uVar2;
  reference pvVar3;
  uint *puVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  ulong in_RDX;
  long in_RSI;
  ans_fold_encode<3U> *in_RDI;
  size_t sym;
  uint64_t tmp;
  uint64_t cur_base;
  uint32_t in_stack_0000007c;
  bool in_stack_00000083;
  uint32_t in_stack_00000084;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000088;
  uint32_t mapped_u32;
  size_t i;
  uint32_t max_sym;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  uint32_t MAX_SIGMA;
  ans_fold_encode<3U> *model;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff10;
  uint16_t in_stack_ffffffffffffff12;
  uint32_t in_stack_ffffffffffffff14;
  allocator_type *in_stack_ffffffffffffff18;
  long lVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  size_type sVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff30;
  vector<enc_entry_fold,_std::allocator<enc_entry_fold>_> *this;
  size_type local_a8;
  long local_a0;
  vector<enc_entry_fold,_std::allocator<enc_entry_fold>_> local_80;
  uint32_t local_64;
  ulong local_60;
  uint local_58 [6];
  undefined8 local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  byte local_1d;
  undefined4 local_1c;
  ulong local_18;
  long local_10;
  
  local_1c = 0x1000;
  local_1d = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ans_fold_encode((ans_fold_encode<3U> *)
                  CONCAT44(in_stack_ffffffffffffff14,
                           CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10)));
  local_40 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2120a2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (value_type_conflict2 *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2120d0);
  local_58[0] = 0;
  for (local_60 = 0; local_60 < local_18; local_60 = local_60 + 1) {
    local_64 = ans_fold_mapping<3u>(*(uint32_t *)(local_10 + local_60 * 4));
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_38,(ulong)local_64);
    *pvVar3 = *pvVar3 + 1;
    puVar4 = std::max<unsigned_int>(&local_64,local_58);
    local_58[0] = *puVar4;
  }
  adjust_freqs(in_stack_00000088,in_stack_00000084,in_stack_00000083,in_stack_0000007c);
  this = &local_80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_ffffffffffffff20,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff20);
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff08._M_current);
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff08._M_current);
  __first._M_current._2_2_ = in_stack_ffffffffffffff12;
  __first._M_current._0_2_ = in_stack_ffffffffffffff10;
  __first._M_current._4_4_ = in_stack_ffffffffffffff14;
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (__first,in_stack_ffffffffffffff08,0);
  in_RDI->frame_size = (long)iVar1;
  uVar2 = 0;
  local_a0 = 0x1000000000;
  std::vector<enc_entry_fold,_std::allocator<enc_entry_fold>_>::resize
            (this,in_stack_ffffffffffffff28);
  local_a8 = 0;
  while( true ) {
    sVar9 = local_a8;
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&in_RDI->nfreqs);
    if (sVar5 <= sVar9) break;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_a8);
    in_stack_ffffffffffffff12 = (uint16_t)*pvVar6;
    pvVar7 = std::vector<enc_entry_fold,_std::allocator<enc_entry_fold>_>::operator[]
                       (&in_RDI->table,local_a8);
    pvVar7->freq = in_stack_ffffffffffffff12;
    in_stack_ffffffffffffff14 = uVar2;
    pvVar7 = std::vector<enc_entry_fold,_std::allocator<enc_entry_fold>_>::operator[]
                       (&in_RDI->table,local_a8);
    pvVar7->base = in_stack_ffffffffffffff14;
    lVar8 = local_a0;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_a8);
    in_stack_ffffffffffffff20 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar8 * (ulong)*pvVar6);
    pvVar7 = std::vector<enc_entry_fold,_std::allocator<enc_entry_fold>_>::operator[]
                       (&in_RDI->table,local_a8);
    pvVar7->sym_upper_bound = (uint64_t)in_stack_ffffffffffffff20;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_a8);
    uVar2 = *pvVar6 + uVar2;
    local_a8 = local_a8 + 1;
  }
  in_RDI->lower_bound = in_RDI->frame_size << 4;
  local_1d = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff20);
  if ((local_1d & 1) == 0) {
    ~ans_fold_encode((ans_fold_encode<3U> *)
                     CONCAT44(in_stack_ffffffffffffff14,
                              CONCAT22(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10)));
  }
  return in_RDI;
}

Assistant:

static ans_fold_encode create(const uint32_t* in_u32, size_t n)
    {
        const uint32_t MAX_SIGMA = 1 << (fidelity + 8 + 1);
        ans_fold_encode model;
        std::vector<uint64_t> freqs(MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32 = ans_fold_mapping<fidelity>(in_u32[i]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }